

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O0

strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation> * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,int>,void,ezy::features::result_like_continuation>>::
map<____C_A_T_C_H____T_E_S_T____28()::__0&>
          (strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation>
           *__return_storage_ptr__,void *this,anon_class_1_0_00000001 *fn)

{
  strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation> *psVar1;
  anon_class_1_0_00000001 *in_RCX;
  anon_class_1_0_00000001 *fn_local;
  impl<ezy::strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation>_>
  *this_local;
  
  psVar1 = _impl::
           map<ezy::strong_type<std::variant<int,int>,void,ezy::features::result_like_continuation>,____C_A_T_C_H____T_E_S_T____28()::__0&>
                     (__return_storage_ptr__,(_impl *)this,
                      (strong_type<std::variant<int,_int>,_void,_ezy::features::result_like_continuation>
                       *)fn,in_RCX);
  return psVar1;
}

Assistant:

constexpr decltype(auto) map(Fn&& fn) &&
      {
        return _impl::map(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }